

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawTests.cpp
# Opt level: O0

bool deqp::gles31::Functional::anon_unknown_0::verifyImageYellowGreen(Surface *image,TestLog *log)

{
  RGBA RVar1;
  int iVar2;
  int iVar3;
  MessageBuilder *this;
  TestLog *pTVar4;
  byte local_5c5;
  allocator<char> local_599;
  string local_598;
  allocator<char> local_571;
  string local_570;
  LogImage local_550;
  allocator<char> local_4b9;
  string local_4b8;
  allocator<char> local_491;
  string local_490;
  LogImageSet local_470;
  allocator<char> local_429;
  string local_428;
  allocator<char> local_401;
  string local_400;
  LogImage local_3e0;
  allocator<char> local_349;
  string local_348;
  allocator<char> local_321;
  string local_320;
  LogImage local_300;
  allocator<char> local_269;
  string local_268;
  allocator<char> local_241;
  string local_240;
  LogImageSet local_220;
  MessageBuilder local_1e0;
  RGBA local_5c;
  byte local_55;
  bool pixelOk;
  RGBA local_48;
  int local_44;
  RGBA pixel;
  int x;
  int y;
  bool isOk;
  Surface error;
  int colorThreshold;
  TestLog *log_local;
  Surface *image_local;
  
  error.m_pixels.m_cap._4_4_ = 0x14;
  iVar2 = tcu::Surface::getWidth(image);
  iVar3 = tcu::Surface::getHeight(image);
  tcu::Surface::Surface((Surface *)&y,iVar2,iVar3);
  x._3_1_ = true;
  pixel.m_value = 0;
  while( true ) {
    RVar1.m_value = pixel.m_value;
    iVar2 = tcu::Surface::getHeight(image);
    if (iVar2 <= (int)RVar1.m_value) break;
    local_44 = 0;
    while( true ) {
      iVar2 = local_44;
      iVar3 = tcu::Surface::getWidth(image);
      if (iVar3 <= iVar2) break;
      local_48 = tcu::Surface::getPixel(image,local_44,pixel.m_value);
      local_55 = 1;
      iVar2 = tcu::RGBA::getGreen(&local_48);
      iVar2 = de::abs<int>(iVar2 + -0xff);
      if (0x14 < iVar2) {
        local_55 = 0;
      }
      iVar2 = tcu::RGBA::getBlue(&local_48);
      iVar3 = de::abs<int>(iVar2);
      RVar1 = pixel;
      iVar2 = local_44;
      if (0x14 < iVar3) {
        local_55 = 0;
      }
      if ((local_55 & 1) == 0) {
        tcu::RGBA::RGBA(&local_5c,0xff,0,0,0xff);
      }
      else {
        tcu::RGBA::RGBA(&local_5c,0,0xff,0,0xff);
      }
      tcu::Surface::setPixel((Surface *)&y,iVar2,RVar1.m_value,local_5c);
      local_5c5 = 0;
      if (x._3_1_ != false) {
        local_5c5 = local_55;
      }
      x._3_1_ = (bool)(local_5c5 & 1);
      local_44 = local_44 + 1;
    }
    pixel.m_value = pixel.m_value + 1;
  }
  if (x._3_1_ == false) {
    tcu::TestLog::operator<<(&local_1e0,log,(BeginMessageToken *)&tcu::TestLog::Message);
    this = tcu::MessageBuilder::operator<<(&local_1e0,(char (*) [27])"Image verification failed.");
    tcu::MessageBuilder::operator<<(this,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1e0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_240,"Verfication result",&local_241);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_268,"Result of rendering",&local_269);
    tcu::LogImageSet::LogImageSet(&local_220,&local_240,&local_268);
    pTVar4 = tcu::TestLog::operator<<(log,&local_220);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_320,"Result",&local_321);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,"Result",&local_349);
    tcu::LogImage::LogImage(&local_300,&local_320,&local_348,image,QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar4 = tcu::TestLog::operator<<(pTVar4,&local_300);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_400,"ErrorMask",&local_401);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_428,"Error mask",&local_429)
    ;
    tcu::LogImage::LogImage
              (&local_3e0,&local_400,&local_428,(Surface *)&y,QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar4 = tcu::TestLog::operator<<(pTVar4,&local_3e0);
    tcu::TestLog::operator<<(pTVar4,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
    tcu::LogImage::~LogImage(&local_3e0);
    std::__cxx11::string::~string((string *)&local_428);
    std::allocator<char>::~allocator(&local_429);
    std::__cxx11::string::~string((string *)&local_400);
    std::allocator<char>::~allocator(&local_401);
    tcu::LogImage::~LogImage(&local_300);
    std::__cxx11::string::~string((string *)&local_348);
    std::allocator<char>::~allocator(&local_349);
    std::__cxx11::string::~string((string *)&local_320);
    std::allocator<char>::~allocator(&local_321);
    tcu::LogImageSet::~LogImageSet(&local_220);
    std::__cxx11::string::~string((string *)&local_268);
    std::allocator<char>::~allocator(&local_269);
    std::__cxx11::string::~string((string *)&local_240);
    std::allocator<char>::~allocator(&local_241);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_490,"Verfication result",&local_491);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4b8,"Result of rendering",&local_4b9);
    tcu::LogImageSet::LogImageSet(&local_470,&local_490,&local_4b8);
    pTVar4 = tcu::TestLog::operator<<(log,&local_470);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_570,"Result",&local_571);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_598,"Result",&local_599);
    tcu::LogImage::LogImage(&local_550,&local_570,&local_598,image,QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar4 = tcu::TestLog::operator<<(pTVar4,&local_550);
    tcu::TestLog::operator<<(pTVar4,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
    tcu::LogImage::~LogImage(&local_550);
    std::__cxx11::string::~string((string *)&local_598);
    std::allocator<char>::~allocator(&local_599);
    std::__cxx11::string::~string((string *)&local_570);
    std::allocator<char>::~allocator(&local_571);
    tcu::LogImageSet::~LogImageSet(&local_470);
    std::__cxx11::string::~string((string *)&local_4b8);
    std::allocator<char>::~allocator(&local_4b9);
    std::__cxx11::string::~string((string *)&local_490);
    std::allocator<char>::~allocator(&local_491);
  }
  tcu::Surface::~Surface((Surface *)&y);
  return x._3_1_;
}

Assistant:

static bool verifyImageYellowGreen (const tcu::Surface& image, tcu::TestLog& log)
{
	using tcu::TestLog;

	const int colorThreshold	= 20;

	tcu::Surface error			(image.getWidth(), image.getHeight());
	bool isOk					= true;

	for (int y = 0; y < image.getHeight(); y++)
	for (int x = 0; x < image.getWidth(); x++)
	{
		const tcu::RGBA pixel = image.getPixel(x, y);
		bool pixelOk = true;

		// Any pixel with !(G ~= 255) is faulty (not a linear combinations of green and yellow)
		if (de::abs(pixel.getGreen() - 255) > colorThreshold)
			pixelOk = false;

		// Any pixel with !(B ~= 0) is faulty (not a linear combinations of green and yellow)
		if (de::abs(pixel.getBlue() - 0) > colorThreshold)
			pixelOk = false;

		error.setPixel(x, y, (pixelOk) ? (tcu::RGBA(0, 255, 0, 255)) : (tcu::RGBA(255, 0, 0, 255)));
		isOk = isOk && pixelOk;
	}

	if (!isOk)
	{
		log << TestLog::Message << "Image verification failed." << TestLog::EndMessage;
		log << TestLog::ImageSet("Verfication result", "Result of rendering")
			<< TestLog::Image("Result",		"Result",		image)
			<< TestLog::Image("ErrorMask",	"Error mask",	error)
			<< TestLog::EndImageSet;
	}
	else
	{
		log << TestLog::ImageSet("Verfication result", "Result of rendering")
			<< TestLog::Image("Result", "Result", image)
			<< TestLog::EndImageSet;
	}

	return isOk;
}